

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.h
# Opt level: O0

void __thiscall pbrt::AsyncJob<pbrt::Image_*>::DoWork(AsyncJob<pbrt::Image_*> *this)

{
  bool bVar1;
  mutex_type *in_RDI;
  char (*in_stack_00000010) [20];
  unique_lock<std::mutex> l;
  Image *r;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffd4;
  
  std::function<pbrt::Image_*()>::operator()
            ((function<pbrt::Image_*()> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI);
  bVar1 = pstd::optional<pbrt::Image_*>::has_value((optional<pbrt::Image_*> *)(in_RDI + 2));
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffd0);
  if (!bVar1) {
    pstd::optional<pbrt::Image_*>::operator=
              ((optional<pbrt::Image_*> *)CONCAT44(in_stack_ffffffffffffffd4,uVar2),(Image **)in_RDI
              );
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)CONCAT44(in_stack_ffffffffffffffd4,uVar2));
    return;
  }
  LogFatal<char_const(&)[20]>(this._4_4_,(char *)r,l._12_4_,(char *)l._M_device,in_stack_00000010);
}

Assistant:

void DoWork() {
        T r = func();
        std::unique_lock<std::mutex> l(mutex);
        CHECK(!result.has_value());
        result = r;
        cv.notify_all();
    }